

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O1

int run_test_tcp_close_reset_accepted(void)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  uv_loop_t *puVar4;
  undefined8 *extraout_RDX;
  uv_tcp_t *in_RSI;
  
  loop = (uv_loop_t *)uv_default_loop();
  start_server(loop,in_RSI);
  client_close = 0;
  shutdown_before_close = 0;
  do_connect(loop,in_RSI);
  if (write_cb_called == 0) {
    if (close_cb_called != 0) goto LAB_00171a2d;
    if (shutdown_cb_called != 0) goto LAB_00171a32;
    in_RSI = (uv_tcp_t *)0x0;
    iVar1 = uv_run(loop);
    if (iVar1 != 0) goto LAB_00171a37;
    if (write_cb_called != 4) goto LAB_00171a3c;
    if (close_cb_called != 1) goto LAB_00171a41;
    if (shutdown_cb_called != 0) goto LAB_00171a46;
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    in_RSI = (uv_tcp_t *)0x0;
    uv_run(uVar3);
    uVar3 = uv_default_loop();
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_tcp_close_reset_accepted_cold_1();
LAB_00171a2d:
    run_test_tcp_close_reset_accepted_cold_2();
LAB_00171a32:
    run_test_tcp_close_reset_accepted_cold_3();
LAB_00171a37:
    run_test_tcp_close_reset_accepted_cold_4();
LAB_00171a3c:
    run_test_tcp_close_reset_accepted_cold_5();
LAB_00171a41:
    run_test_tcp_close_reset_accepted_cold_6();
LAB_00171a46:
    run_test_tcp_close_reset_accepted_cold_7();
  }
  run_test_tcp_close_reset_accepted_cold_8();
  loop = (uv_loop_t *)uv_default_loop();
  start_server(loop,in_RSI);
  client_close = 0;
  shutdown_before_close = 1;
  puVar4 = loop;
  do_connect(loop,in_RSI);
  iVar1 = (int)in_RSI;
  if (write_cb_called == 0) {
    if (close_cb_called != 0) goto LAB_00171b04;
    if (shutdown_cb_called != 0) goto LAB_00171b09;
    iVar1 = 0;
    puVar4 = loop;
    iVar2 = uv_run(loop);
    if (iVar2 != 0) goto LAB_00171b0e;
    if (write_cb_called != 4) goto LAB_00171b13;
    if (close_cb_called != 0) goto LAB_00171b18;
    if (shutdown_cb_called != 1) goto LAB_00171b1d;
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    iVar1 = 0;
    uv_run(uVar3);
    puVar4 = (uv_loop_t *)uv_default_loop();
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_tcp_close_reset_accepted_after_shutdown_cold_1();
LAB_00171b04:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_2();
LAB_00171b09:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_3();
LAB_00171b0e:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_4();
LAB_00171b13:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_5();
LAB_00171b18:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_6();
LAB_00171b1d:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_7();
  }
  run_test_tcp_close_reset_accepted_after_shutdown_cold_8();
  if (iVar1 == 0) {
    iVar1 = uv_tcp_init(loop,&tcp_accepted);
    if (iVar1 == 0) {
      iVar1 = uv_accept(puVar4,&tcp_accepted);
      if (iVar1 == 0) {
        iVar1 = uv_read_start(&tcp_accepted,alloc_cb,read_cb);
        return iVar1;
      }
      goto LAB_00171b7e;
    }
  }
  else {
    connection_cb_cold_1();
  }
  connection_cb_cold_2();
LAB_00171b7e:
  connection_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x400;
  return 0x31d840;
}

Assistant:

TEST_IMPL(tcp_close_reset_accepted) {
  int r;

  loop = uv_default_loop();

  start_server(loop, &tcp_server);

  client_close = 0;
  shutdown_before_close = 0;

  do_connect(loop, &tcp_client);

  ASSERT(write_cb_called == 0);
  ASSERT(close_cb_called == 0);
  ASSERT(shutdown_cb_called == 0);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(write_cb_called == 4);
  ASSERT(close_cb_called == 1);
  ASSERT(shutdown_cb_called == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}